

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushItemWidth(float item_width)

{
  ImVector<float> *pIVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  float *__src;
  ImGuiContext *pIVar4;
  float *__dest;
  int iVar5;
  int iVar6;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  iVar6 = (pIVar3->DC).ItemWidthStack.Size;
  iVar2 = (pIVar3->DC).ItemWidthStack.Capacity;
  if (iVar6 == iVar2) {
    iVar6 = iVar6 + 1;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      __dest = (float *)MemAlloc((long)iVar6 << 2);
      __src = (pIVar3->DC).ItemWidthStack.Data;
      if (__src != (float *)0x0) {
        memcpy(__dest,__src,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
        MemFree((pIVar3->DC).ItemWidthStack.Data);
      }
      (pIVar3->DC).ItemWidthStack.Data = __dest;
      (pIVar3->DC).ItemWidthStack.Capacity = iVar6;
    }
  }
  (pIVar3->DC).ItemWidthStack.Data[(pIVar3->DC).ItemWidthStack.Size] = (pIVar3->DC).ItemWidth;
  pIVar1 = &(pIVar3->DC).ItemWidthStack;
  pIVar1->Size = pIVar1->Size + 1;
  if ((item_width == 0.0) && (!NAN(item_width))) {
    item_width = pIVar3->ItemWidthDefault;
  }
  (pIVar3->DC).ItemWidth = item_width;
  *(byte *)&(pIVar4->NextItemData).Flags = (byte)(pIVar4->NextItemData).Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushItemWidth(float item_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    window->DC.ItemWidth = (item_width == 0.0f ? window->ItemWidthDefault : item_width);
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}